

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

idx_t __thiscall
duckdb::GroupedAggregateHashTable::FindOrCreateGroupsInternal
          (GroupedAggregateHashTable *this,DataChunk *groups,Vector *group_hashes_v,
          Vector *addresses_v,SelectionVector *new_groups_out)

{
  DataChunk *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  ht_entry_t *phVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  hash_t hVar7;
  long lVar8;
  ulong uVar9;
  Vector *pVVar10;
  idx_t need_compare_idx;
  ulong uVar11;
  SelectionVector *pSVar12;
  TupleDataLayout *pTVar13;
  reference pvVar14;
  reference other;
  pointer this_01;
  type pTVar15;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *puVar16;
  PartitionedTupleData *this_02;
  PartitionedTupleDataAppendState *pPVar17;
  idx_t iVar18;
  InternalException *pIVar19;
  ulong uVar20;
  idx_t iVar21;
  sel_t sVar22;
  idx_t iVar23;
  idx_t grp_idx;
  ulong uVar24;
  idx_t count;
  undefined1 auVar25 [16];
  double dVar26;
  ulong local_110;
  optional_ptr<duckdb::PartitionedTupleDataAppendState,_true> local_100;
  DataChunk *local_f8;
  idx_t local_f0;
  TupleDataLayout *local_e8;
  SelectionVector *local_e0;
  idx_t no_match_count;
  PartitionedTupleDataAppendState *local_d0;
  Vector *local_c8;
  shared_ptr<duckdb::TupleDataLayout,_true> *local_c0;
  SelectionVector *local_b8;
  SelectionVector *local_b0;
  data_ptr_t local_a8;
  string local_a0;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *local_80;
  TupleDataChunkState *local_78;
  PartitionedTupleDataAppendState *local_70;
  RowMatcher *local_68;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *local_60;
  TupleDataChunkState *local_58;
  SelectionVector *local_50;
  sel_t *local_48;
  sel_t *local_40;
  ulong local_38;
  
  iVar18 = groups->count;
  uVar11 = this->count + iVar18;
  uVar24 = this->capacity;
  local_c8 = addresses_v;
  local_50 = new_groups_out;
  if ((uVar24 < uVar11) ||
     (auVar25._8_4_ = (int)(uVar24 >> 0x20), auVar25._0_8_ = uVar24, auVar25._12_4_ = 0x45300000,
     dVar26 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0)) / 1.25,
     uVar20 = (ulong)dVar26,
     ((long)(dVar26 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) < uVar11)) {
    Resize(this,uVar24 * 2);
  }
  pSVar12 = FlatVector::IncrementalSelectionVector();
  this_00 = &(this->state).group_chunk;
  if (*(pointer *)
       ((long)&(this->state).group_chunk.data.
               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data + 8) ==
      (this->state).group_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pTVar13 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                        (&(this->super_BaseAggregateHashTable).layout_ptr);
    DataChunk::InitializeEmpty(this_00,&pTVar13->types);
  }
  local_d0 = &(this->state).partitioned_append_state;
  for (uVar24 = 0;
      uVar11 = ((long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68, uVar24 < uVar11; uVar24 = uVar24 + 1)
  {
    pvVar14 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar24);
    other = vector<duckdb::Vector,_true>::get<true>(&groups->data,uVar24);
    Vector::Reference(pvVar14,other);
  }
  pvVar14 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar11);
  Vector::Reference(pvVar14,group_hashes_v);
  (this->state).group_chunk.count = groups->count;
  local_58 = &(this->state).partitioned_append_state.chunk_state;
  TupleDataCollection::ToUnifiedFormat(local_58,this_00);
  Vector::Flatten(group_hashes_v,iVar18);
  pVVar10 = local_c8;
  pdVar1 = group_hashes_v->data;
  Vector::Flatten(local_c8,iVar18);
  pdVar2 = pVVar10->data;
  if (this->skip_lookups == false) {
    pdVar3 = (this->state).ht_offsets.data;
    local_a8 = (this->state).hash_salts.data;
    phVar4 = this->entries;
    pTVar13 = (TupleDataLayout *)0x0;
    for (iVar21 = 0; iVar18 != iVar21; iVar21 = iVar21 + 1) {
      uVar24 = this->bitmask & *(ulong *)(pdVar1 + iVar21 * 8);
      *(ulong *)(pdVar3 + iVar21 * 8) = uVar24;
      pTVar13 = (TupleDataLayout *)
                ((long)&(pTVar13->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                (ulong)(phVar4[uVar24].value != 0));
      *(ulong *)(local_a8 + iVar21 * 8) = *(ulong *)(pdVar1 + iVar21 * 8) | 0xffffffffffff;
    }
    local_b0 = &(this->state).group_compare_vector;
    local_b8 = &(this->state).empty_vector;
    local_60 = &this->partitioned_data;
    local_70 = &(this->state).unpartitioned_append_state;
    local_78 = &(this->state).unpartitioned_append_state.chunk_state;
    local_80 = &this->unpartitioned_data;
    local_c0 = &(this->super_BaseAggregateHashTable).layout_ptr;
    local_68 = &this->row_matcher;
    local_e0 = &(this->state).no_match_vector;
    local_f0 = 0;
    uVar24 = 0;
    local_f8 = this_00;
    while ((uVar11 = this->capacity, iVar18 != 0 && (uVar24 < uVar11))) {
      no_match_count = 0;
      psVar5 = pSVar12->sel_vector;
      psVar6 = local_b0->sel_vector;
      local_40 = local_b8->sel_vector;
      local_48 = local_50->sel_vector;
      iVar21 = 0;
      count = 0;
      local_110 = 0;
      while (local_e8 = pTVar13, local_38 = uVar24, iVar21 != iVar18) {
        iVar23 = iVar21;
        if (psVar5 != (sel_t *)0x0) {
          iVar23 = (idx_t)psVar5[iVar21];
        }
        hVar7 = *(hash_t *)(local_a8 + iVar23 * 8);
        phVar4 = this->entries;
        for (uVar20 = 0; uVar20 < uVar11; uVar20 = uVar20 + 1) {
          lVar8 = *(long *)(pdVar3 + iVar23 * 8);
          uVar9 = phVar4[lVar8].value;
          sVar22 = (sel_t)iVar23;
          if (uVar9 == 0) {
            phVar4[lVar8].value = hVar7;
            local_40[local_110] = sVar22;
            local_110 = local_110 + 1;
            local_48[local_f0] = sVar22;
            local_f0 = local_f0 + 1;
            break;
          }
          if ((uVar9 | 0xffffffffffff) == hVar7) {
            psVar6[count] = sVar22;
            count = count + 1;
            break;
          }
          *(ulong *)(pdVar3 + iVar23 * 8) = lVar8 + 1U & this->bitmask;
          uVar11 = this->capacity;
        }
        iVar21 = iVar21 + 1;
        if (uVar20 == uVar11) {
          pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_a0,
                     "Maximum inner iteration count reached in GroupedAggregateHashTable",
                     (allocator *)&local_100);
          InternalException::InternalException(pIVar19,&local_a0);
          __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if ((TupleDataLayout *)(local_110 + count) < pTVar13) {
        pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_a0,"Internal validation failed in GroupedAggregateHashTable",
                   (allocator *)&local_100);
        InternalException::InternalException(pIVar19,&local_a0);
        __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_110 != 0) {
        local_a0._M_dataplus._M_p = (pointer)0x0;
        local_100.ptr = (PartitionedTupleDataAppendState *)0x0;
        puVar16 = local_60;
        pPVar17 = local_d0;
        if (local_110 >> ((byte)this->radix_bits & 0x3f) < 5 && 2 < this->radix_bits) {
          TupleDataCollection::ToUnifiedFormat(local_78,local_f8);
          puVar16 = local_80;
          pPVar17 = local_70;
        }
        local_a0._M_dataplus._M_p =
             (pointer)(puVar16->
                      super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
                      .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
        local_100.ptr = pPVar17;
        this_02 = optional_ptr<duckdb::PartitionedTupleData,_true>::operator->
                            ((optional_ptr<duckdb::PartitionedTupleData,_true> *)&local_a0);
        pPVar17 = optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::operator*(&local_100)
        ;
        PartitionedTupleData::AppendUnified(this_02,pPVar17,local_f8,local_b8,local_110);
        local_e8 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(local_c0);
        pPVar17 = optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::operator->
                            (&local_100);
        pSVar12 = FlatVector::IncrementalSelectionVector();
        RowOperations::InitializeStates
                  (local_e8,&(pPVar17->chunk_state).row_locations,pSVar12,local_110);
        pPVar17 = optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::operator->
                            (&local_100);
        pdVar1 = (pPVar17->chunk_state).row_locations.data;
        pPVar17 = optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::operator->
                            (&local_100);
        for (uVar24 = 0; local_110 != uVar24; uVar24 = uVar24 + 1) {
          uVar20 = (ulong)(this->state).empty_vector.sel_vector[uVar24];
          uVar11 = *(ulong *)(pdVar1 + (ulong)(pPVar17->reverse_partition_sel).sel_vector[uVar20] *
                                       8);
          this->entries[*(long *)(pdVar3 + uVar20 * 8)].value =
               this->entries[*(long *)(pdVar3 + uVar20 * 8)].value & (uVar11 | 0xffff000000000000);
          *(ulong *)(pdVar2 + uVar20 * 8) = uVar11;
        }
      }
      if (count != 0) {
        for (iVar18 = 0; count != iVar18; iVar18 = iVar18 + 1) {
          uVar24 = (ulong)(this->state).group_compare_vector.sel_vector[iVar18];
          *(hash_t *)(pdVar2 + uVar24 * 8) =
               this->entries[*(long *)(pdVar3 + uVar24 * 8)].value & 0xffffffffffff;
        }
        pTVar15 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(local_c0);
        RowMatcher::Match(local_68,local_f8,&local_58->vector_data,local_b0,count,pTVar15,local_c8,
                          local_e0,&no_match_count);
      }
      psVar5 = local_e0->sel_vector;
      for (uVar24 = 0; uVar24 < no_match_count; uVar24 = uVar24 + 1) {
        *(ulong *)(pdVar3 + (ulong)psVar5[uVar24] * 8) =
             *(long *)(pdVar3 + (ulong)psVar5[uVar24] * 8) + 1U & this->bitmask;
      }
      pTVar13 = (TupleDataLayout *)0x0;
      pSVar12 = local_e0;
      iVar18 = no_match_count;
      uVar24 = local_38 + 1;
    }
    iVar18 = local_f0;
    if (uVar24 == uVar11) {
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_a0,
                 "Maximum outer iteration count reached in GroupedAggregateHashTable",
                 (allocator *)&no_match_count);
      InternalException::InternalException(pIVar19,&local_a0);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    this_01 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              ::operator->(&this->partitioned_data);
    pSVar12 = FlatVector::IncrementalSelectionVector();
    PartitionedTupleData::AppendUnified(this_01,local_d0,this_00,pSVar12,iVar18);
    pTVar15 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                        (&(this->super_BaseAggregateHashTable).layout_ptr);
    pSVar12 = FlatVector::IncrementalSelectionVector();
    RowOperations::InitializeStates
              (pTVar15,&(this->state).partitioned_append_state.chunk_state.row_locations,pSVar12,
               iVar18);
    pdVar1 = (this->state).partitioned_append_state.chunk_state.row_locations.data;
    for (iVar21 = 0; iVar18 != iVar21; iVar21 = iVar21 + 1) {
      *(undefined8 *)(pdVar2 + iVar21 * 8) =
           *(undefined8 *)
            (pdVar1 + (ulong)(this->state).partitioned_append_state.reverse_partition_sel.sel_vector
                             [iVar21] * 8);
    }
  }
  this->count = this->count + iVar18;
  return iVar18;
}

Assistant:

idx_t GroupedAggregateHashTable::FindOrCreateGroupsInternal(DataChunk &groups, Vector &group_hashes_v,
                                                            Vector &addresses_v, SelectionVector &new_groups_out) {
	D_ASSERT(groups.ColumnCount() + 1 == layout_ptr->ColumnCount());
	D_ASSERT(group_hashes_v.GetType() == LogicalType::HASH);
	D_ASSERT(state.ht_offsets.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(state.ht_offsets.GetType() == LogicalType::UBIGINT);
	D_ASSERT(addresses_v.GetType() == LogicalType::POINTER);
	D_ASSERT(state.hash_salts.GetType() == LogicalType::HASH);

	// Need to fit the entire vector, and resize at threshold
	const auto chunk_size = groups.size();
	if (Count() + chunk_size > capacity || Count() + chunk_size > ResizeThreshold()) {
		Verify();
		Resize(capacity * 2);
	}
	D_ASSERT(capacity - Count() >= chunk_size); // we need to be able to fit at least one vector of data

	// we start out with all entries [0, 1, 2, ..., chunk_size]
	const SelectionVector *sel_vector = FlatVector::IncrementalSelectionVector();

	// Make a chunk that references the groups and the hashes and convert to unified format
	if (state.group_chunk.ColumnCount() == 0) {
		state.group_chunk.InitializeEmpty(layout_ptr->GetTypes());
	}
	D_ASSERT(state.group_chunk.ColumnCount() == layout_ptr->GetTypes().size());
	for (idx_t grp_idx = 0; grp_idx < groups.ColumnCount(); grp_idx++) {
		state.group_chunk.data[grp_idx].Reference(groups.data[grp_idx]);
	}
	state.group_chunk.data[groups.ColumnCount()].Reference(group_hashes_v);
	state.group_chunk.SetCardinality(groups);

	// convert all vectors to unified format
	TupleDataCollection::ToUnifiedFormat(state.partitioned_append_state.chunk_state, state.group_chunk);

	group_hashes_v.Flatten(chunk_size);
	const auto hashes = FlatVector::GetData<hash_t>(group_hashes_v);

	addresses_v.Flatten(chunk_size);
	const auto addresses = FlatVector::GetData<data_ptr_t>(addresses_v);

	if (skip_lookups) {
		// Just appending now
		partitioned_data->AppendUnified(state.partitioned_append_state, state.group_chunk,
		                                *FlatVector::IncrementalSelectionVector(), chunk_size);
		RowOperations::InitializeStates(*layout_ptr, state.partitioned_append_state.chunk_state.row_locations,
		                                *FlatVector::IncrementalSelectionVector(), chunk_size);

		const auto row_locations =
		    FlatVector::GetData<data_ptr_t>(state.partitioned_append_state.chunk_state.row_locations);
		const auto &row_sel = state.partitioned_append_state.reverse_partition_sel;
		for (idx_t i = 0; i < chunk_size; i++) {
			const auto &row_idx = row_sel[i];
			const auto &row_location = row_locations[row_idx];
			addresses[i] = row_location;
		}
		count += chunk_size;
		return chunk_size;
	}

	// Compute the entry in the table based on the hash using a modulo,
	// and precompute the hash salts for faster comparison below
	const auto ht_offsets = FlatVector::GetData<uint64_t>(state.ht_offsets);
	const auto hash_salts = FlatVector::GetData<hash_t>(state.hash_salts);

	// We also compute the occupied count, which is essentially useless.
	// However, this loop is branchless, while the main lookup loop below is not.
	// So, by doing the lookups here, we better amortize cache misses.
	idx_t occupied_count = 0;
	for (idx_t r = 0; r < chunk_size; r++) {
		const auto &hash = hashes[r];
		auto &ht_offset = ht_offsets[r];
		ht_offset = ApplyBitMask(hash);
		occupied_count += entries[ht_offset].IsOccupied(); // Lookup
		D_ASSERT(ht_offset == hash % capacity);
		hash_salts[r] = ht_entry_t::ExtractSalt(hash);
	}

	idx_t new_group_count = 0;
	idx_t remaining_entries = chunk_size;
	idx_t iteration_count;
	for (iteration_count = 0; remaining_entries > 0 && iteration_count < capacity; iteration_count++) {
		idx_t new_entry_count = 0;
		idx_t need_compare_count = 0;
		idx_t no_match_count = 0;

		// For each remaining entry, figure out whether or not it belongs to a full or empty group
		for (idx_t i = 0; i < remaining_entries; i++) {
			const auto index = sel_vector->get_index(i);
			const auto salt = hash_salts[index];
			auto &ht_offset = ht_offsets[index];

			idx_t inner_iteration_count;
			for (inner_iteration_count = 0; inner_iteration_count < capacity; inner_iteration_count++) {
				auto &entry = entries[ht_offset];
				if (!entry.IsOccupied()) { // Unoccupied: claim it
					entry.SetSalt(salt);
					state.empty_vector.set_index(new_entry_count++, index);
					new_groups_out.set_index(new_group_count++, index);
					break;
				}

				if (DUCKDB_LIKELY(entry.GetSalt() == salt)) { // Matching salt: compare groups
					state.group_compare_vector.set_index(need_compare_count++, index);
					break;
				}

				// Linear probing
				IncrementAndWrap(ht_offset, bitmask);
			}
			if (DUCKDB_UNLIKELY(inner_iteration_count == capacity)) {
				throw InternalException("Maximum inner iteration count reached in GroupedAggregateHashTable");
			}
		}

		if (DUCKDB_UNLIKELY(occupied_count > new_entry_count + need_compare_count)) {
			// We use the useless occupied_count we summed above here so the variable is used,
			// and the compiler cannot optimize away the vectorized lookups above. This should never be triggered.
			throw InternalException("Internal validation failed in GroupedAggregateHashTable");
		}
		occupied_count = 0; // Have to set to 0 for next iterations

		if (new_entry_count != 0) {
			// Append everything that belongs to an empty group
			optional_ptr<PartitionedTupleData> data;
			optional_ptr<PartitionedTupleDataAppendState> append_state;
			if (radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD &&
			    new_entry_count / RadixPartitioning::NumberOfPartitions(radix_bits) <= 4) {
				TupleDataCollection::ToUnifiedFormat(state.unpartitioned_append_state.chunk_state, state.group_chunk);
				data = unpartitioned_data.get();
				append_state = &state.unpartitioned_append_state;
			} else {
				data = partitioned_data.get();
				append_state = &state.partitioned_append_state;
			}
			data->AppendUnified(*append_state, state.group_chunk, state.empty_vector, new_entry_count);
			RowOperations::InitializeStates(*layout_ptr, append_state->chunk_state.row_locations,
			                                *FlatVector::IncrementalSelectionVector(), new_entry_count);

			// Set the entry pointers in the 1st part of the HT now that the data has been appended
			const auto row_locations = FlatVector::GetData<data_ptr_t>(append_state->chunk_state.row_locations);
			const auto &row_sel = append_state->reverse_partition_sel;
			for (idx_t new_entry_idx = 0; new_entry_idx < new_entry_count; new_entry_idx++) {
				const auto &index = state.empty_vector[new_entry_idx];
				const auto &row_idx = row_sel[index];
				const auto &row_location = row_locations[row_idx];

				auto &entry = entries[ht_offsets[index]];

				entry.SetPointer(row_location);
				addresses[index] = row_location;
			}
		}

		if (need_compare_count != 0) {
			// Get the pointers to the rows that need to be compared
			for (idx_t need_compare_idx = 0; need_compare_idx < need_compare_count; need_compare_idx++) {
				const auto &index = state.group_compare_vector[need_compare_idx];
				const auto &entry = entries[ht_offsets[index]];
				addresses[index] = entry.GetPointer();
			}

			// Perform group comparisons
			row_matcher.Match(state.group_chunk, state.partitioned_append_state.chunk_state.vector_data,
			                  state.group_compare_vector, need_compare_count, *layout_ptr, addresses_v,
			                  &state.no_match_vector, no_match_count);
		}

		// Linear probing: each of the entries that do not match move to the next entry in the HT
		for (idx_t i = 0; i < no_match_count; i++) {
			const auto &index = state.no_match_vector[i];
			auto &ht_offset = ht_offsets[index];
			IncrementAndWrap(ht_offset, bitmask);
		}
		sel_vector = &state.no_match_vector;
		remaining_entries = no_match_count;
	}
	if (iteration_count == capacity) {
		throw InternalException("Maximum outer iteration count reached in GroupedAggregateHashTable");
	}

	count += new_group_count;
	return new_group_count;
}